

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::StartEmitCatch(ByteCodeGenerator *this,ParseNodeCatch *pnodeCatch)

{
  Symbol *this_00;
  code *pcVar1;
  anon_class_24_3_b926b611 handler;
  FuncInfo *pFVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  ParseNodeParamPattern *pPVar6;
  ParseNodePtr pPVar7;
  ParseNodeName *pPVar8;
  bool local_89;
  bool local_7a;
  bool local_79;
  bool local_69;
  bool local_59;
  Symbol *sym;
  ParseNode *pnode1;
  FuncInfo *funcInfo;
  Scope *scope;
  ParseNodeCatch *pnodeCatch_local;
  ByteCodeGenerator *this_local;
  
  scope = (Scope *)pnodeCatch;
  pnodeCatch_local = (ParseNodeCatch *)this;
  if ((pnodeCatch->super_ParseNodeStmt).super_ParseNode.nop != knopCatch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0xfa2,"(pnodeCatch->nop == knopCatch)","pnodeCatch->nop == knopCatch");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  funcInfo = *(FuncInfo **)&scope->scopeType;
  pnode1 = (ParseNode *)Scope::GetFunc((Scope *)funcInfo);
  bVar3 = FuncInfo::GetCallsEval((FuncInfo *)pnode1);
  if (((bVar3) || (bVar3 = FuncInfo::GetChildCallsEval((FuncInfo *)pnode1), bVar3)) ||
     ((this->flags & 0x404) != 0)) {
    Scope::SetIsObject((Scope *)funcInfo);
  }
  bVar3 = ParseNodeCatch::HasPatternParam((ParseNodeCatch *)scope);
  if (bVar3) {
    pPVar7 = ParseNodeCatch::GetParam((ParseNodeCatch *)scope);
    pPVar6 = ParseNode::AsParseNodeParamPattern(pPVar7);
    pFVar2 = funcInfo;
    pPVar7 = (pPVar6->super_ParseNodeUni).pnode1;
    bVar3 = FuncInfo::GetCallsEval((FuncInfo *)pnode1);
    local_59 = true;
    if (!bVar3) {
      local_59 = FuncInfo::GetChildCallsEval((FuncInfo *)pnode1);
    }
    Scope::SetCapturesAll((Scope *)pFVar2,local_59);
    pFVar2 = funcInfo;
    iVar4 = Scope::Count((Scope *)funcInfo);
    local_69 = false;
    if (0 < iVar4) {
      bVar3 = Scope::GetMustInstantiate((Scope *)funcInfo);
      local_79 = true;
      if (!bVar3) {
        bVar3 = Scope::GetCapturesAll((Scope *)funcInfo);
        local_79 = true;
        if (!bVar3) {
          local_79 = FuncInfo::IsGlobalFunction((FuncInfo *)pnode1);
        }
      }
      local_69 = local_79;
    }
    Scope::SetMustInstantiate((Scope *)pFVar2,local_69);
    handler.scope = (Scope **)&funcInfo;
    handler.funcInfo = (FuncInfo **)&pnode1;
    handler.this = this;
    Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitCatch(ParseNodeCatch*)::__0>
              (pPVar7,handler);
  }
  else {
    bVar3 = ParseNodeCatch::HasParam((ParseNodeCatch *)scope);
    if (bVar3) {
      pPVar7 = ParseNodeCatch::GetParam((ParseNodeCatch *)scope);
      pPVar8 = ParseNode::AsParseNodeName(pPVar7);
      pFVar2 = funcInfo;
      this_00 = pPVar8->sym;
      bVar3 = FuncInfo::GetCallsEval((FuncInfo *)pnode1);
      local_7a = true;
      if (!bVar3) {
        bVar3 = FuncInfo::GetChildCallsEval((FuncInfo *)pnode1);
        local_7a = true;
        if (!bVar3) {
          local_7a = Symbol::GetHasNonLocalReference(this_00);
        }
      }
      Scope::SetCapturesAll((Scope *)pFVar2,local_7a);
      pFVar2 = funcInfo;
      bVar3 = Scope::GetCapturesAll((Scope *)funcInfo);
      local_89 = true;
      if (!bVar3) {
        local_89 = FuncInfo::IsGlobalFunction((FuncInfo *)pnode1);
      }
      Scope::SetMustInstantiate((Scope *)pFVar2,local_89);
      bVar3 = FuncInfo::IsGlobalFunction((FuncInfo *)pnode1);
      if (bVar3) {
        Symbol::SetIsGlobalCatch(this_00,true);
      }
      bVar3 = Symbol::NeedsScopeObject(this_00);
      if (bVar3) {
        Scope::SetIsObject((Scope *)funcInfo);
      }
      bVar3 = Scope::GetMustInstantiate((Scope *)funcInfo);
      if ((bVar3) && (bVar3 = Symbol::IsInSlot(this_00,this,(FuncInfo *)pnode1,false), bVar3)) {
        ProcessCapturedSym(this,this_00);
        Symbol::EnsureScopeSlot(this_00,this,(FuncInfo *)pnode1);
      }
    }
  }
  PushScope(this,(Scope *)funcInfo);
  return;
}

Assistant:

void ByteCodeGenerator::StartEmitCatch(ParseNodeCatch *pnodeCatch)
{
    Assert(pnodeCatch->nop == knopCatch);

    Scope *scope = pnodeCatch->scope;
    FuncInfo *funcInfo = scope->GetFunc();

    // Catch scope is a dynamic object if it can be passed to a scoped lookup helper (i.e., eval is present or we're in an event handler).
    if (funcInfo->GetCallsEval() || funcInfo->GetChildCallsEval() || (this->flags & (fscrEval | fscrImplicitThis)))
    {
        scope->SetIsObject();
    }

    if (pnodeCatch->HasPatternParam())
    {
        ParseNode *pnode1 = pnodeCatch->GetParam()->AsParseNodeParamPattern()->pnode1;
        scope->SetCapturesAll(funcInfo->GetCallsEval() || funcInfo->GetChildCallsEval());
        scope->SetMustInstantiate(scope->Count() > 0 && (scope->GetMustInstantiate() || scope->GetCapturesAll() || funcInfo->IsGlobalFunction()));

        Parser::MapBindIdentifier(pnode1, [&](ParseNodePtr item)
        {
            Symbol *sym = item->AsParseNodeVar()->sym;
            if (funcInfo->IsGlobalFunction())
            {
                sym->SetIsGlobalCatch(true);
            }

            if (sym->NeedsScopeObject())
            {
                scope->SetIsObject();
            }

            Assert(sym->GetScopeSlot() == Js::Constants::NoProperty);
            if (sym->NeedsSlotAlloc(this, funcInfo))
            {
                sym->EnsureScopeSlot(this, funcInfo);
            }
        });
    }
    else if (pnodeCatch->HasParam())
    {
        Symbol *sym = pnodeCatch->GetParam()->AsParseNodeName()->sym;

        // Catch object is stored in the catch scope if there may be an ambiguous lookup or a var declaration that hides it.
        scope->SetCapturesAll(funcInfo->GetCallsEval() || funcInfo->GetChildCallsEval() || sym->GetHasNonLocalReference());
        scope->SetMustInstantiate(scope->GetCapturesAll() || funcInfo->IsGlobalFunction());

        if (funcInfo->IsGlobalFunction())
        {
            sym->SetIsGlobalCatch(true);
        }

        if (sym->NeedsScopeObject())
        {
            scope->SetIsObject();
        }

        if (scope->GetMustInstantiate())
        {
            if (sym->IsInSlot(this, funcInfo))
            {
                // Since there is only one symbol we are pushing to slot.
                // Also in order to make IsInSlot to return true - forcing the sym-has-non-local-reference.
                this->ProcessCapturedSym(sym);
                sym->EnsureScopeSlot(this, funcInfo);
            }
        }
    }

    PushScope(scope);
}